

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O3

void __thiscall
libcellml::GeneratorProfile::setImplementationInitialiseVariablesMethodString
          (GeneratorProfile *this,bool forDifferentialModel,bool withExternalVariables,
          string *implementationInitialiseVariablesMethodString)

{
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)&(this->mPimpl->mImplementationInitialiseVariablesMethodFamWoevString).
                     _M_dataplus._M_p +
             (ulong)(uint)((int)CONCAT71(in_register_00000031,forDifferentialModel) << 7 |
                          (int)CONCAT71(in_register_00000011,withExternalVariables) << 6)));
  return;
}

Assistant:

void GeneratorProfile::setImplementationInitialiseVariablesMethodString(bool forDifferentialModel,
                                                                        bool withExternalVariables,
                                                                        const std::string &implementationInitialiseVariablesMethodString)
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            mPimpl->mImplementationInitialiseVariablesMethodFdmWevString = implementationInitialiseVariablesMethodString;
        } else {
            mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString = implementationInitialiseVariablesMethodString;
        }
    } else {
        if (withExternalVariables) {
            mPimpl->mImplementationInitialiseVariablesMethodFamWevString = implementationInitialiseVariablesMethodString;
        } else {
            mPimpl->mImplementationInitialiseVariablesMethodFamWoevString = implementationInitialiseVariablesMethodString;
        }
    }
}